

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall
Matrix::GetInverse(Matrix *__return_storage_ptr__,Matrix *this,ChoiceType choice_type)

{
  bool bVar1;
  ostream *this_00;
  bool linear_independent;
  Matrix local_178;
  undefined1 local_158 [8];
  LinearSystem inverser;
  ChoiceType choice_type_local;
  Matrix *this_local;
  
  inverser.history_.
  super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = choice_type;
  if (this->n_ == this->m_) {
    Identity(&local_178,this->n_);
    LinearSystem::LinearSystem((LinearSystem *)local_158,this,&local_178,Standard);
    ~Matrix(&local_178);
    bVar1 = LinearSystem::RunGauss
                      ((LinearSystem *)local_158,
                       inverser.history_.
                       super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    this_00 = operator<<((ostream *)Options::writer_abi_cxx11_,(LinearSystem *)local_158);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if (bVar1) {
      LinearSystem::GetSolutionMatrix(__return_storage_ptr__,(LinearSystem *)local_158);
    }
    else {
      Matrix(__return_storage_ptr__,this->n_,this->n_,0);
    }
    LinearSystem::~LinearSystem((LinearSystem *)local_158);
    return __return_storage_ptr__;
  }
  __assert_fail("n_ == m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/matrix.cpp"
                ,0x1a9,"Matrix Matrix::GetInverse(Options::ChoiceType) const");
}

Assistant:

Matrix Matrix::GetInverse(Options::ChoiceType choice_type) const {
  assert(n_ == m_);
  LinearSystem inverser(*this, Identity(n_));
  bool linear_independent = inverser.RunGauss(choice_type);
  Options::writer << inverser << std::endl;
  if (!linear_independent) {
    return Matrix(n_, n_);
  }

  return inverser.GetSolutionMatrix();
}